

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_assertion_tests.cpp
# Opt level: O2

void __thiscall
iu_ExpressionNotFail_x_iutest_x_Logical_Test::Body
          (iu_ExpressionNotFail_x_iutest_x_Logical_Test *this)

{
  ScopedSPITestFlag SVar1;
  TestFlag *pTVar2;
  char *in_R9;
  ScopedSPITestFlag guard_2;
  ExpressionResult local_330;
  iuCodeMessage local_308;
  int local_2d4 [3];
  SPIFailureChecker iutest_failure_checker;
  AssertionResult iutest_ar;
  AssertionResult iutest_spi_ar;
  undefined1 local_240 [40];
  ScopedSPITestFlag guard;
  string local_210 [32];
  AssertionResult iutest_spi_ar_1;
  int local_1c4;
  ScopedSPITestFlag guard_1;
  undefined4 uStack_1bc;
  bool local_1a0;
  Fixed local_198;
  
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  iutest_spi_ar_1.m_message._M_dataplus._M_p._0_4_ = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS
            ((ExpressionLHS<int> *)local_240,(int *)&iutest_spi_ar_1);
  guard_1.super_ScopedGuard.m_test_flags = (ScopedGuard)0x2a;
  iutest::detail::ExpressionLHS<int>::operator!=
            (&local_330,(ExpressionLHS<int> *)local_240,(int *)&guard_1);
  guard_2.super_ScopedGuard.m_test_flags._0_1_ = 1;
  iutest::detail::ExpressionResult::operator||
            ((ExpressionResult *)&local_308,&local_330,(bool *)&guard_2);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)&local_198,(ExpressionResult *)&local_308,false);
  iutest::AssertionResult::AssertionResult(&iutest_ar,(AssertionResult *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)(local_240 + 8));
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)&local_330,(internal *)&iutest_ar,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() != 42 || f() == 42))"
               ,"false","true",in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_308,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0xde,local_330.m_result.m_message._M_dataplus._M_p);
    local_308._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_308,&local_198);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_330);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)guard.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"expansion: 42 != 42 || true",(allocator<char> *)&local_308);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0xde,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_failure_checker,&local_198);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_1);
  guard_2.super_ScopedGuard.m_test_flags = (ScopedGuard)0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS((ExpressionLHS<int> *)local_240,(int *)&guard_2)
  ;
  local_2d4[2] = 0x2a;
  iutest::detail::ExpressionLHS<int>::operator!=
            (&local_330,(ExpressionLHS<int> *)local_240,local_2d4 + 2);
  local_2d4[1] = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS((ExpressionLHS<int> *)&guard,local_2d4 + 1);
  local_2d4[0] = 0x2a;
  iutest::detail::ExpressionLHS<int>::operator==
            ((ExpressionResult *)&iutest_spi_ar,(ExpressionLHS<int> *)&guard,local_2d4);
  iutest::detail::ExpressionResult::operator||
            ((ExpressionResult *)&local_308,&local_330,(ExpressionResult *)&iutest_spi_ar);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)&local_198,(ExpressionResult *)&local_308,false);
  iutest::AssertionResult::AssertionResult(&iutest_ar,(AssertionResult *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  std::__cxx11::string::~string(local_210);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)(local_240 + 8));
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)&local_330,(internal *)&iutest_ar,
               (AssertionResult *)
               "IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() != 42 || ::iutest::detail::ExpressionDecomposer()->* f() == 42))"
               ,"false","true",in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_308,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0xdf,local_330.m_result.m_message._M_dataplus._M_p);
    local_308._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_308,&local_198);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_330);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar1 = guard_1;
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)SVar1.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"expansion: 42 != 42 || 42 == 42",(allocator<char> *)&local_308);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar_1,&iutest_failure_checker,(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar_1.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0xdf,(char *)CONCAT44(iutest_spi_ar_1.m_message._M_dataplus._M_p._4_4_,
                                      iutest_spi_ar_1.m_message._M_dataplus._M_p._0_4_));
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_failure_checker,&local_198);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar_1);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  local_2d4[2] = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS((ExpressionLHS<int> *)local_240,local_2d4 + 2);
  local_2d4[1] = 0x2a;
  iutest::detail::ExpressionLHS<int>::operator!=
            (&local_330,(ExpressionLHS<int> *)local_240,local_2d4 + 1);
  local_2d4[0] = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS
            ((ExpressionLHS<int> *)&iutest_spi_ar_1,local_2d4);
  local_1c4 = 0x2a;
  iutest::detail::ExpressionLHS<int>::operator==
            ((ExpressionResult *)&guard,(ExpressionLHS<int> *)&iutest_spi_ar_1,&local_1c4);
  iutest::detail::ExpressionResult::GetResult(&iutest_spi_ar,(ExpressionResult *)&guard);
  iutest::detail::ExpressionResult::operator||
            ((ExpressionResult *)&local_308,&local_330,&iutest_spi_ar);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)&local_198,(ExpressionResult *)&local_308,false);
  iutest::AssertionResult::AssertionResult(&iutest_ar,(AssertionResult *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  std::__cxx11::string::~string((string *)&guard);
  std::__cxx11::string::~string((string *)&iutest_spi_ar_1.m_message._M_string_length);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)(local_240 + 8));
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)&local_330,(internal *)&iutest_ar,
               (AssertionResult *)
               "IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() != 42 || (::iutest::detail::ExpressionDecomposer()->* f() == 42).GetResult()))"
               ,"false","true",in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_308,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0xe0,local_330.m_result.m_message._M_dataplus._M_p);
    local_308._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_308,&local_198);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_330);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar1 = guard_2;
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)SVar1.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"expansion: 42 != 42 || 42 == 42",(allocator<char> *)&local_308);
  iutest::detail::SPIFailureChecker::GetResult
            ((AssertionResult *)&guard_1,&iutest_failure_checker,(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (local_1a0 == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0xe0,(char *)CONCAT44(uStack_1bc,guard_1.super_ScopedGuard.m_test_flags));
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_failure_checker,&local_198);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&guard_1);
  return;
}

Assistant:

IUTEST(ExpressionNotFail, Logical)
{
    CHECK_FATAL_FAILURE( IUTEST_ASSERT_NOT(f() != 42 || f() == 42 ), "expansion: 42 != 42 || true");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT_NOT(f() != 42 IUTEST_OPERAND(||) f() == 42 ), "expansion: 42 != 42 || 42 == 42");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT_NOT(f() != 42 || IUTEST_EXPRESSION(f() == 42) ), "expansion: 42 != 42 || 42 == 42");
}